

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::JsonReporter::sectionStarting(JsonReporter *this,SectionInfo *sectionInfo)

{
  StringRef value;
  JsonObjectWriter *pJVar1;
  _Elt_pointer pJVar2;
  StringRef value_00;
  StringRef key;
  undefined1 auStack_1b8 [408];
  
  pJVar1 = startObject(this);
  JsonObjectWriter::write((JsonObjectWriter *)auStack_1b8,(int)pJVar1,"kind",4);
  value_00.m_size = 7;
  value_00.m_start = "section";
  JsonValueWriter::writeImpl((JsonValueWriter *)auStack_1b8,value_00,true);
  std::__cxx11::stringstream::~stringstream((stringstream *)(auStack_1b8 + 8));
  std::ios_base::~ios_base((ios_base *)(auStack_1b8 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)auStack_1b8,(int)pJVar1,"name",4);
  value.m_start = (sectionInfo->name)._M_dataplus._M_p;
  value.m_size = (sectionInfo->name)._M_string_length;
  JsonValueWriter::writeImpl((JsonValueWriter *)auStack_1b8,value,true);
  std::__cxx11::stringstream::~stringstream((stringstream *)(auStack_1b8 + 8));
  std::ios_base::~ios_base((ios_base *)(auStack_1b8 + 0x88));
  pJVar2 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  anon_unknown_26::writeSourceInfo(pJVar2 + -1,&sectionInfo->lineInfo);
  key.m_size = 4;
  key.m_start = "path";
  startArray(this,key);
  return;
}

Assistant:

void JsonReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        assert( isInside( Writer::Array ) &&
                "Section should always start inside an object" );
        // We want to nest top level sections, even though it shares name
        // and source loc with the TEST_CASE
        auto& sectionObject = startObject();
        sectionObject.write( "kind"_sr ).write( "section"_sr );
        sectionObject.write( "name"_sr ).write( sectionInfo.name );
        writeSourceInfo( m_objectWriters.top(), sectionInfo.lineInfo );


        // TBD: Do we want to create this event lazily? It would become
        //      rather complex, but we could do it, and it would look
        //      better for empty sections. OTOH, empty sections should
        //      be rare.
        startArray( "path"_sr );
    }